

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VgaDebugGenerator.cpp
# Opt level: O1

void __thiscall VgaDebugGenerator::Generate_Modules(VgaDebugGenerator *this,ofstream *fout)

{
  Module *module;
  _Hash_node_base *p_Var1;
  
  for (p_Var1 = (this->modules)._M_h._M_before_begin._M_nxt; p_Var1 != (_Hash_node_base *)0x0;
      p_Var1 = p_Var1->_M_nxt) {
    module = (Module *)(p_Var1 + 5);
    Generate_Outputs(this,module,fout);
    Generate_Assignments(this,module,fout);
    Generate_Declaration(this,module,fout);
    Generate_Arguments(this,module,fout);
  }
  return;
}

Assistant:

void VgaDebugGenerator::Generate_Modules(std::ofstream &fout) {
    for (const auto &[_, module] : modules) {
        Generate_Outputs(module, fout);
        Generate_Assignments(module, fout);
        Generate_Declaration(module, fout);
        Generate_Arguments(module, fout);
    }
}